

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

int Sbd_ManImplement(Sbd_Man_t *p,int Pivot,word Truth)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint Entry;
  Gia_Obj_t *pGVar5;
  int Fill;
  long lVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  int iVar9;
  word Truth_local;
  
  iVar9 = p->pGia->nObjs;
  Truth_local = Truth;
  iVar2 = Vec_IntEntry(p->vLutLevs,Pivot);
  p->vLits->nSize = 0;
  for (iVar8 = 0; iVar8 < p->vDivSet->nSize; iVar8 = iVar8 + 1) {
    iVar3 = Vec_IntEntry(p->vDivSet,iVar8);
    iVar3 = Vec_IntEntry(p->vWinObjs,iVar3);
    iVar4 = Vec_IntEntry(p->vMirrors,iVar3);
    pVVar7 = p->vLits;
    if (iVar4 < 0) {
      iVar3 = Abc_Var2Lit(iVar3,0);
    }
    else {
      iVar3 = Vec_IntEntry(p->vMirrors,iVar3);
    }
    Vec_IntPush(pVVar7,iVar3);
  }
  pGVar1 = p->pGia;
  if ((pGVar1->nXors != 0) && (pGVar1->pMuxes == (uint *)0x0)) {
    pGVar1->pMuxes = (uint *)p;
  }
  Entry = Dsm_ManTruthToGia(pGVar1,&Truth_local,p->vLits,p->vCover);
  if ((Sbd_Man_t *)p->pGia->pMuxes == p) {
    p->pGia->pMuxes = (uint *)0x0;
  }
  iVar8 = Vec_IntEntry(p->vMirrors,Pivot);
  if (iVar8 != -1) {
    __assert_fail("Vec_IntEntry(p->vMirrors, Pivot) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                  ,0x70e,"int Sbd_ManImplement(Sbd_Man_t *, int, word)");
  }
  Vec_IntWriteEntry(p->vMirrors,Pivot,Entry);
  if (p->pPars->fVerbose != 0) {
    printf("Replacing node %d by literal %d.\n",Pivot,(ulong)Entry);
  }
  iVar8 = 0;
  while( true ) {
    pVVar7 = p->vLits;
    iVar3 = pVVar7->nSize;
    if (iVar3 <= iVar8) break;
    iVar3 = Vec_IntEntry(pVVar7,iVar8);
    pVVar7 = p->vLits;
    iVar3 = Abc_Lit2Var(iVar3);
    Vec_IntWriteEntry(pVVar7,iVar8,iVar3);
    iVar8 = iVar8 + 1;
  }
  for (iVar8 = 0; iVar8 < iVar3; iVar8 = iVar8 + 1) {
    pGVar1 = p->pGia;
    iVar3 = Vec_IntEntry(pVVar7,iVar8);
    pGVar5 = Gia_ManObj(pGVar1,iVar3);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    pGVar5->field_0x3 = pGVar5->field_0x3 | 0x40;
    pVVar7 = p->vLits;
    iVar3 = pVVar7->nSize;
  }
  if (p->vLutLevs->nSize != iVar9) {
    __assert_fail("Vec_IntSize(p->vLutLevs) == iObjLast",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                  ,0x719,"int Sbd_ManImplement(Sbd_Man_t *, int, word)");
  }
  for (; iVar9 < p->pGia->nObjs; iVar9 = iVar9 + 1) {
    Vec_IntPush(p->vLutLevs,0);
    Vec_IntPush(p->vObj2Var,0);
    Vec_IntPush(p->vMirrors,-1);
    Vec_IntFillExtra(p->vLutCuts,p->vLutCuts->nSize + p->pPars->nLutSize + 1,Fill);
    Sbd_ManFindCut(p,iVar9,p->vLits);
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      for (iVar8 = 0; iVar8 < p->pPars->nWords; iVar8 = iVar8 + 1) {
        Vec_WrdPush(p->vSims[lVar6],0);
      }
    }
  }
  for (iVar9 = 0; iVar9 < p->vLits->nSize; iVar9 = iVar9 + 1) {
    pGVar1 = p->pGia;
    iVar8 = Vec_IntEntry(p->vLits,iVar9);
    pGVar5 = Gia_ManObj(pGVar1,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    pGVar5->field_0x3 = pGVar5->field_0x3 & 0xbf;
  }
  pVVar7 = p->vLutLevs;
  iVar9 = Abc_Lit2Var(Entry);
  iVar9 = Vec_IntEntry(pVVar7,iVar9);
  if (iVar2 <= iVar9) {
    __assert_fail("iNewLev < iCurLev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                  ,0x72a,"int Sbd_ManImplement(Sbd_Man_t *, int, word)");
  }
  iVar8 = Vec_IntEntry(p->vLutLevs,Pivot);
  if (iVar8 != iVar2) {
    __assert_fail("Vec_IntEntry(p->vLutLevs, Pivot) == iCurLev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                  ,0x72c,"int Sbd_ManImplement(Sbd_Man_t *, int, word)");
  }
  Vec_IntWriteEntry(p->vLutLevs,Pivot,iVar9);
  return 0;
}

Assistant:

int Sbd_ManImplement( Sbd_Man_t * p, int Pivot, word Truth )
{
    Gia_Obj_t * pObj;
    int i, k, w, iLit, Entry, Node;
    int iObjLast = Gia_ManObjNum(p->pGia);
    int iCurLev = Vec_IntEntry(p->vLutLevs, Pivot);
    int iNewLev;
    // collect leaf literals
    Vec_IntClear( p->vLits );
    Vec_IntForEachEntry( p->vDivSet, Node, i )
    {
        Node = Vec_IntEntry( p->vWinObjs, Node );
        if ( Vec_IntEntry(p->vMirrors, Node) >= 0 )
            Vec_IntPush( p->vLits, Vec_IntEntry(p->vMirrors, Node) );
        else
            Vec_IntPush( p->vLits, Abc_Var2Lit(Node, 0) );
    }
    // pretend to have MUXes
//    assert( p->pGia->pMuxes == NULL );
    if ( p->pGia->nXors && p->pGia->pMuxes == NULL )
        p->pGia->pMuxes = (unsigned *)p;
    // derive new function of the node
    iLit = Dsm_ManTruthToGia( p->pGia, &Truth, p->vLits, p->vCover );
    if ( p->pGia->pMuxes == (unsigned *)p )
        p->pGia->pMuxes = NULL;
    // remember this function
    assert( Vec_IntEntry(p->vMirrors, Pivot) == -1 );
    Vec_IntWriteEntry( p->vMirrors, Pivot, iLit );
    if ( p->pPars->fVerbose )
        printf( "Replacing node %d by literal %d.\n", Pivot, iLit );
    // translate literals into variables
    Vec_IntForEachEntry( p->vLits, Entry, i )
        Vec_IntWriteEntry( p->vLits, i, Abc_Lit2Var(Entry) );
    // label inputs
    Gia_ManForEachObjVec( p->vLits, p->pGia, pObj, i )
        pObj->fMark0 = 1;
    // extend data-structure to accommodate new nodes
    assert( Vec_IntSize(p->vLutLevs) == iObjLast );
    for ( i = iObjLast; i < Gia_ManObjNum(p->pGia); i++ )
    {
        Vec_IntPush( p->vLutLevs, 0 );
        Vec_IntPush( p->vObj2Var, 0 );
        Vec_IntPush( p->vMirrors, -1 );
        Vec_IntFillExtra( p->vLutCuts, Vec_IntSize(p->vLutCuts) + p->pPars->nLutSize + 1, 0 );
        Sbd_ManFindCut( p, i, p->vLits );
        for ( k = 0; k < 4; k++ )
            for ( w = 0; w < p->pPars->nWords; w++ )
                Vec_WrdPush( p->vSims[k], 0 );
    }
    // unlabel inputs
    Gia_ManForEachObjVec( p->vLits, p->pGia, pObj, i )
        pObj->fMark0 = 0;
    // make sure delay reduction is achieved
    iNewLev = Vec_IntEntry( p->vLutLevs, Abc_Lit2Var(iLit) );
    assert( iNewLev < iCurLev );
    // update delay of the initial node
    assert( Vec_IntEntry(p->vLutLevs, Pivot) == iCurLev );
    Vec_IntWriteEntry( p->vLutLevs, Pivot, iNewLev );
    //Vec_IntWriteEntry( p->vLevs, Pivot, 1+Abc_MaxInt(Vec_IntEntry(p->vLevs, Gia_ObjFaninId0(pObj, Pivot)), Vec_IntEntry(p->vLevs, Gia_ObjFaninId1(pObj, Pivot))) );
    return 0;
}